

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(int lhs,SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  uint uVar2;
  uint in_ESI;
  int in_EDI;
  int ret;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  uint *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  int local_c;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  uint local_4;
  
  local_c = in_EDI;
  local_8.m_int = in_ESI;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_10);
  bVar1 = DivisionCornerCaseHelper<unsigned_int,_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1(local_c,local_8,&local_10);
  if (bVar1) {
    local_4 = local_10.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<unsigned_int,_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::DivisionCornerCase2(local_c,local_8,&local_10);
    if (bVar1) {
      local_4 = local_10.m_int;
    }
    else {
      uVar3 = 0;
      uVar2 = SafeInt::operator_cast_to_unsigned_int
                        ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)(ulong)in_stack_ffffffffffffffe0);
      DivisionHelper<int,_unsigned_int,_2>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((int *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffd8,(int *)0x1a6064);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(uVar3,uVar2),(int *)in_stack_ffffffffffffffd8);
    }
  }
  return (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_4;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}